

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O2

string * __thiscall
MinVR::VRError::_errorMessage_abi_cxx11_(string *__return_storage_ptr__,VRError *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&bStack_38,"Error: ",&this->_whatMsg);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  if ((this->_adviceMsg)._M_string_length != 0) {
    std::operator+(&bStack_38,"\n",&this->_adviceMsg);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _errorMessage() const {

    std::string out;

    out = "Error: " + _whatMsg
#ifdef MinVR_DEBUG
      // There is no need to burden the ultimate user with
      // implementation details, so this is inside a DEBUG condition.
      + "\n(MinVR Error reported at " + _whereFile + ":" + _whereLine
      + ", while executing " + _whereFunc + ".)"
#endif
      ;

    if (!_adviceMsg.empty()) {
      out += "\n" + _adviceMsg;
    }

    return out;
  }